

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretbox.h
# Opt level: O1

int hydro_secretbox_probe_verify(uint8_t *probe,uint8_t *c,size_t c_len,char *ctx,uint8_t *key)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint8_t *b1;
  uint8_t computed_probe [16];
  byte local_28 [24];
  
  iVar2 = -1;
  if (0x23 < c_len) {
    hydro_hash_hash(local_28,0x10,c + 0x14,0x10,ctx,key);
    bVar1 = -(local_28 == probe);
    lVar3 = 0;
    do {
      bVar1 = bVar1 | local_28[lVar3] ^ probe[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    iVar2 = 0;
    if ((bVar1 - 1 >> 8 & 1) == 0) {
      lVar3 = 0;
      do {
        local_28[lVar3] = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int
hydro_secretbox_probe_verify(const uint8_t probe[hydro_secretbox_PROBEBYTES], const uint8_t *c,
                             size_t c_len, const char ctx[hydro_secretbox_CONTEXTBYTES],
                             const uint8_t key[hydro_secretbox_KEYBYTES])
{
    uint8_t        computed_probe[hydro_secretbox_PROBEBYTES];
    const uint8_t *mac;

    if (c_len < hydro_secretbox_HEADERBYTES) {
        return -1;
    }
    mac = &c[hydro_secretbox_SIVBYTES];
    hydro_hash_hash(computed_probe, hydro_secretbox_PROBEBYTES, mac, hydro_secretbox_MACBYTES, ctx,
                    key);
    if (hydro_equal(computed_probe, probe, hydro_secretbox_PROBEBYTES) == 1) {
        return 0;
    }
    hydro_memzero(computed_probe, hydro_secretbox_PROBEBYTES);
    return -1;
}